

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O1

bool __thiscall Transform::intersect(Transform *this,Ray *r,float tmin,Hit *h)

{
  Matrix4f *mat;
  int iVar1;
  Ray new_r;
  VecUtils local_ac [12];
  Vector3f local_a0;
  Vector3f local_94;
  Vector3f local_88;
  Vector3f local_7c;
  Matrix4f local_70;
  
  mat = &this->_m_inverse;
  Vector3f::Vector3f(&local_a0,&r->_origin);
  VecUtils::transformPoint((VecUtils *)&local_70,mat,&local_a0);
  Vector3f::Vector3f(&local_94,&r->_direction);
  VecUtils::transformDirection(local_ac,mat,&local_94);
  Vector3f::Vector3f(&local_88,(Vector3f *)&local_70);
  Vector3f::Vector3f(&local_7c,(Vector3f *)local_ac);
  iVar1 = (*this->_object->_vptr_Object3D[2])((ulong)(uint)tmin,this->_object,&local_88,h);
  if (SUB41(iVar1,0) != false) {
    Matrix4f::transposed(&local_70,mat);
    VecUtils::transformDirection(local_ac,&local_70,&h->normal);
    Vector3f::normalized(&local_a0);
    Vector3f::operator=(&h->normal,&local_a0);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool Transform::intersect(const Ray &r, float tmin, Hit &h) const {
    Ray new_r(VecUtils::transformPoint(_m_inverse, r.getOrigin()),
              VecUtils::transformDirection(_m_inverse, r.getDirection()));

    bool hit = _object->intersect(new_r, tmin, h);
    if (hit) {
        h.normal = VecUtils::transformDirection(_m_inverse.transposed(), h.normal).normalized();
    }
    return hit;
}